

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O2

int __thiscall deqp::ub::UniformLayout::getUniformIndex(UniformLayout *this,char *name)

{
  pointer pUVar1;
  bool bVar2;
  long lVar3;
  int ndx;
  long lVar4;
  
  lVar3 = 0;
  lVar4 = 0;
  while( true ) {
    pUVar1 = (this->uniforms).
             super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->uniforms).
                            super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 6) <=
        lVar4) {
      return -1;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pUVar1->name)._M_dataplus._M_p + lVar3),name);
    if (bVar2) break;
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x40;
  }
  return (int)lVar4;
}

Assistant:

int UniformLayout::getUniformIndex(const char* name) const
{
	for (int ndx = 0; ndx < (int)uniforms.size(); ndx++)
	{
		if (uniforms[ndx].name == name)
			return ndx;
	}
	return -1;
}